

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCxxModuleBmiGenerator.cxx
# Opt level: O0

string * __thiscall
cmInstallCxxModuleBmiGenerator::GetScriptLocation
          (string *__return_storage_ptr__,cmInstallCxxModuleBmiGenerator *this,string *config)

{
  ulong uVar1;
  cmAlphaNum local_b8;
  string local_78;
  cmAlphaNum local_58;
  char *local_28;
  char *config_name;
  string *config_local;
  cmInstallCxxModuleBmiGenerator *this_local;
  
  config_name = (char *)config;
  config_local = (string *)this;
  this_local = (cmInstallCxxModuleBmiGenerator *)__return_storage_ptr__;
  local_28 = (char *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    local_28 = "noconfig";
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_78,this->Target);
  cmAlphaNum::cmAlphaNum(&local_58,&local_78);
  cmAlphaNum::cmAlphaNum(&local_b8,"/install-cxx-module-bmi-");
  cmStrCat<char_const*,char[7]>
            (__return_storage_ptr__,&local_58,&local_b8,&local_28,(char (*) [7])0xc1f563);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCxxModuleBmiGenerator::GetScriptLocation(
  std::string const& config) const
{
  char const* config_name = config.c_str();
  if (config.empty()) {
    config_name = "noconfig";
  }
  return cmStrCat(this->Target->GetSupportDirectory(),
                  "/install-cxx-module-bmi-", config_name, ".cmake");
}